

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O3

void __thiscall
unodb::test::
tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::check_absent_keys<int>
          (tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,initializer_list<int> absent_keys)

{
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *ptVar1;
  long lVar2;
  char *message;
  key_type key;
  key_view k;
  _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_98;
  iterator local_90;
  map<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::test::tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  *local_88;
  _Base_ptr local_80;
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *local_78;
  internal local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68 [2];
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *local_58;
  long local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  __extent_storage<18446744073709551615UL> local_40;
  iterator local_38;
  
  local_90 = absent_keys._M_array;
  if (absent_keys._M_len != 0) {
    local_88 = &this->values;
    local_80 = &(this->values)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_78 = &this->test_db;
    local_50 = absent_keys._M_len << 2;
    lVar2 = 0;
    local_58 = this;
    do {
      ptVar1 = local_58;
      k = make_key(local_58,(long)*(int *)((long)local_90 + lVar2));
      key._M_extent._M_extent_value = (size_t)k._M_ptr;
      key._M_ptr = (pointer)ptVar1;
      to_ikey((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
               *)&stack0xffffffffffffffb8,key);
      local_38 = std::
                 _Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 ::find(&local_88->_M_t,(key_type *)&stack0xffffffffffffffb8);
      local_98._M_node = local_80;
      testing::internal::
      CmpHelperEQ<std::_Rb_tree_iterator<std::pair<std::shared_ptr<std::vector<std::byte,std::allocator<std::byte>>>const,std::span<std::byte_const,18446744073709551615ul>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<std::vector<std::byte,std::allocator<std::byte>>>const,std::span<std::byte_const,18446744073709551615ul>>>>
                (local_70,"(values.find(to_ikey(k)))","(values.cend())",&stack0xffffffffffffffc8,
                 &local_98);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_extent_value !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_extent_value);
      }
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffffb8);
        if (local_68[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          message = "";
        }
        else {
          message = (local_68[0]->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffc8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                   ,0x288,message);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&stack0xffffffffffffffb8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_48._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(undefined8 *)local_48._M_head_impl + 8))();
        }
        if (local_68[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          return;
        }
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_68,local_68[0]);
        return;
      }
      if (local_68[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_68,local_68[0]);
      }
      db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
      ::get_internal((get_result *)local_70,local_78,(art_key_type)k);
      lVar2 = lVar2 + 4;
    } while (local_50 != lVar2);
  }
  return;
}

Assistant:

void check_absent_keys(std::initializer_list<T> absent_keys) noexcept(
      noexcept(this->try_get(coerce_key(*absent_keys.begin())))) {
    for (const auto absent_key : absent_keys) {
      const auto k{coerce_key(absent_key)};
      UNODB_ASSERT_EQ(values.find(to_ikey(k)), values.cend());
      try_get(k);
    }
  }